

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O1

void __thiscall BindRnase::Execute(BindRnase *this)

{
  int iVar1;
  int iVar2;
  SpeciesTracker *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar3;
  shared_ptr<Rnase> new_pol;
  Ptr polymer;
  undefined1 local_51;
  Rnase *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Rnase *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_30 [32];
  
  Bind::ChoosePolymer((Bind *)local_30);
  local_40 = (Rnase *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rnase,std::allocator<Rnase>,Rnase_const&>
            (&local_38,&local_40,(allocator<Rnase> *)&local_51,&this->pol_template_);
  std::__shared_ptr<Rnase,(__gnu_cxx::_Lock_policy)2>::_M_enable_shared_from_this_with<Rnase,Rnase>
            ((__shared_ptr<Rnase,(__gnu_cxx::_Lock_policy)2> *)&local_40,local_40);
  local_50 = local_40;
  local_48 = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  (**(code **)(*(_func_int **)local_30._0_8_ + 8))
            (local_30._0_8_,&local_50,&(this->super_Bind).promoter_name_);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  this_00 = SpeciesTracker::Instance();
  local_30._24_8_ = *(_func_int **)(local_30._0_8_ + 0x58);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count;
    do {
      if (iVar2 == 0) {
        local_30._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count;
      bVar3 = iVar2 == iVar1;
      if (bVar3) {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_)->_M_use_count == 0;
  }
  if (bVar3) {
    local_30._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_30._16_8_ = *(_func_int **)(local_30._0_8_ + 0x50);
  }
  Signal<std::shared_ptr<Reaction>_>::Emit
            (&this_00->propensity_signal_,(shared_ptr<Reaction> *)(local_30 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._24_8_);
  }
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if ((element_type *)local_30._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._8_8_);
  }
  return;
}

Assistant:

void BindRnase::Execute() {
  auto polymer = ChoosePolymer();
  auto new_pol = std::make_shared<Rnase>(pol_template_);
  polymer->Bind(new_pol, promoter_name_);
  SpeciesTracker::Instance().propensity_signal_.Emit(polymer->wrapper());
}